

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O1

float Map_MatchComputeReqTimes(Map_Cut_t *pCut,int fPhase,Map_Time_t *ptArrRes)

{
  char cVar1;
  uint uVar2;
  Map_Super_t *pMVar3;
  Map_Node_t *pMVar4;
  float *pfVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  
  pMVar3 = pCut->M[fPhase].pSuperBest;
  uVar2 = pCut->M[fPhase].uPhaseBest;
  ptArrRes->Rise = -3.4028235e+37;
  ptArrRes->Fall = -3.4028235e+37;
  cVar1 = pCut->nLeaves;
  if (0 < (long)cVar1) {
    pfVar5 = &pMVar3->tDelaysF[0].Fall;
    lVar6 = 0;
    do {
      bVar7 = (~uVar2 >> ((uint)lVar6 & 0x1f) & 1) != 0;
      pMVar4 = pCut->ppLeaves[lVar6];
      if ((0.0 < pfVar5[-0x13]) &&
         (fVar8 = pfVar5[-0x13] + pMVar4->tRequired[bVar7].Rise,
         ptArrRes->Rise <= fVar8 && fVar8 != ptArrRes->Rise)) {
        ptArrRes->Rise = fVar8;
      }
      if ((0.0 < pfVar5[-0x12]) &&
         (fVar8 = pfVar5[-0x12] + pMVar4->tRequired[bVar7].Fall,
         ptArrRes->Rise <= fVar8 && fVar8 != ptArrRes->Rise)) {
        ptArrRes->Rise = fVar8;
      }
      if ((0.0 < ((Map_Time_t *)(pfVar5 + -1))->Rise) &&
         (fVar8 = ((Map_Time_t *)(pfVar5 + -1))->Rise + pMVar4->tRequired[bVar7].Rise,
         ptArrRes->Fall <= fVar8 && fVar8 != ptArrRes->Fall)) {
        ptArrRes->Fall = fVar8;
      }
      if ((0.0 < *pfVar5) &&
         (fVar8 = *pfVar5 + pMVar4->tRequired[bVar7].Fall,
         ptArrRes->Fall <= fVar8 && fVar8 != ptArrRes->Fall)) {
        ptArrRes->Fall = fVar8;
      }
      lVar6 = lVar6 + 1;
      pfVar5 = pfVar5 + 3;
    } while (cVar1 != lVar6);
  }
  fVar8 = ptArrRes->Rise;
  if (ptArrRes->Rise <= ptArrRes->Fall) {
    fVar8 = ptArrRes->Fall;
  }
  return fVar8;
}

Assistant:

float Map_MatchComputeReqTimes( Map_Cut_t * pCut, int fPhase, Map_Time_t * ptArrRes )
{
    Map_Time_t * ptArrIn;
    Map_Super_t * pSuper;
    unsigned uPhaseTot;
    int fPinPhase, i;
    float tDelay;

    // get the supergate and the phase
    pSuper = pCut->M[fPhase].pSuperBest;
    uPhaseTot = pCut->M[fPhase].uPhaseBest;

    // propagate the arrival times 
    ptArrRes->Rise = ptArrRes->Fall = -MAP_FLOAT_LARGE;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tRequired + fPinPhase;
//        assert( ptArrIn->Worst < MAP_FLOAT_LARGE );

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    return MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
}